

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void gray_init_cells(PWorker worker,void *buffer,long byte_size)

{
  long byte_size_local;
  void *buffer_local;
  PWorker worker_local;
  
  worker->buffer = buffer;
  worker->buffer_size = byte_size;
  worker->ycells = (PCell_conflict *)buffer;
  worker->cells = (PCell_conflict)0x0;
  worker->max_cells = 0;
  worker->num_cells = 0;
  worker->area = 0;
  worker->cover = 0;
  worker->invalid = 1;
  return;
}

Assistant:

static void
  gray_init_cells( RAS_ARG_ void*  buffer,
                            long   byte_size )
  {
    ras.buffer      = buffer;
    ras.buffer_size = byte_size;

    ras.ycells      = (PCell*) buffer;
    ras.cells       = NULL;
    ras.max_cells   = 0;
    ras.num_cells   = 0;
    ras.area        = 0;
    ras.cover       = 0;
    ras.invalid     = 1;
  }